

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcDecrypt.c
# Opt level: O2

void cbc512Decrypt(ThreefishKey_t *key,uint64_t *iv,uint64_t *cipher_text,uint64_t num_blocks)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t block;
  ulong uVar10;
  uint64_t *in;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  
  uVar5 = 0;
  uVar3 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar11 = 0;
  uVar12 = 0;
  uVar9 = 0;
  uVar4 = 0;
  local_60 = 0;
  local_68 = 0;
  local_70 = 0;
  local_78 = 0;
  local_80 = 0;
  local_88 = 0;
  local_90 = 0;
  in = cipher_text;
  for (uVar10 = 0; uVar10 < num_blocks << 3; uVar10 = uVar10 + 8) {
    bVar13 = (uVar10 & 8) == 0;
    uVar2 = in[1];
    if (bVar13) {
      uVar4 = in[1];
      uVar2 = uVar5;
    }
    uVar5 = uVar2;
    uVar2 = in[2];
    if (bVar13) {
      local_60 = in[2];
      uVar2 = uVar3;
    }
    uVar3 = uVar2;
    uVar2 = in[3];
    if (bVar13) {
      local_68 = in[3];
      uVar2 = uVar6;
    }
    uVar6 = uVar2;
    uVar2 = in[4];
    if (bVar13) {
      local_70 = in[4];
      uVar2 = uVar7;
    }
    uVar7 = uVar2;
    uVar2 = in[5];
    if (bVar13) {
      local_78 = in[5];
      uVar2 = uVar8;
    }
    uVar8 = uVar2;
    uVar2 = in[6];
    if (bVar13) {
      local_80 = in[6];
      uVar2 = uVar11;
    }
    uVar11 = uVar2;
    uVar2 = in[7];
    if (bVar13) {
      local_88 = in[7];
      uVar2 = uVar12;
    }
    uVar12 = uVar2;
    uVar2 = *in;
    if (!bVar13) {
      local_90 = *in;
      uVar2 = uVar9;
    }
    uVar9 = uVar2;
    threefishDecryptBlockWords(key,in,in);
    if (uVar10 == 0) {
      *cipher_text = *cipher_text ^ *iv;
      cipher_text[1] = cipher_text[1] ^ iv[1];
      cipher_text[2] = cipher_text[2] ^ iv[2];
      cipher_text[3] = cipher_text[3] ^ iv[3];
      cipher_text[4] = cipher_text[4] ^ iv[4];
      cipher_text[5] = cipher_text[5] ^ iv[5];
      cipher_text[6] = cipher_text[6] ^ iv[6];
      uVar2 = iv[7];
      puVar1 = cipher_text + 7;
    }
    else {
      puVar1 = in + 7;
      if ((uVar10 & 8) == 0) {
        *in = *in ^ local_90;
        in[1] = in[1] ^ uVar5;
        in[2] = in[2] ^ uVar3;
        in[3] = in[3] ^ uVar6;
        in[4] = in[4] ^ uVar7;
        in[5] = in[5] ^ uVar8;
        in[6] = in[6] ^ uVar11;
        uVar2 = uVar12;
      }
      else {
        *in = *in ^ uVar9;
        in[1] = in[1] ^ uVar4;
        in[2] = in[2] ^ local_60;
        in[3] = in[3] ^ local_68;
        in[4] = in[4] ^ local_70;
        in[5] = in[5] ^ local_78;
        in[6] = in[6] ^ local_80;
        uVar2 = local_88;
      }
    }
    *puVar1 = *puVar1 ^ uVar2;
    in = in + 8;
  }
  return;
}

Assistant:

void cbc512Decrypt(ThreefishKey_t* key,
                   const uint64_t* iv,
                   uint64_t* cipher_text,
                   const uint64_t num_blocks)
{
    pd3("cbc512Decrypt()\n");
    uint64_t prev_block_odd[SECURE_SLICE] = {0, 0, 0 ,0 ,0 ,0 ,0 ,0}; //allocate 1 block of storage to store the previous cipher text 
    uint64_t prev_block_even[SECURE_SLICE] = {0, 0, 0 ,0 ,0 ,0 ,0 ,0}; //allocate 1 block of storage to store the previous cipher text
    
    pd3("decrypting %lu blocks\n", num_blocks);
    //pBuff(32, (uint8_t*)iv);

    for(uint64_t block=0; block<(num_blocks*SECURE_SLICE); block+=SECURE_SLICE) //run each block through the cipher (in decrypt mode)
    {
        bool even = ((block/SECURE_SLICE)%2 == 0) ? true : false;

        if(even)
        {
            //save the previous cipher text block if it is even 
            prev_block_even[0] = cipher_text[block];
            prev_block_even[1] = cipher_text[block+1];
            prev_block_even[2] = cipher_text[block+2];
            prev_block_even[3] = cipher_text[block+3];
            prev_block_even[4] = cipher_text[block+4];
            prev_block_even[5] = cipher_text[block+5];
            prev_block_even[6] = cipher_text[block+6];
            prev_block_even[7] = cipher_text[block+7];
        }
	else
        {
            //save the previous cipher text block if it is odd
            prev_block_odd[0] = cipher_text[block];
            prev_block_odd[1] = cipher_text[block+1];
            prev_block_odd[2] = cipher_text[block+2];
            prev_block_odd[3] = cipher_text[block+3];
            prev_block_odd[4] = cipher_text[block+4];
            prev_block_odd[5] = cipher_text[block+5];
            prev_block_odd[6] = cipher_text[block+6];
            prev_block_odd[7] = cipher_text[block+7];
        }

        //Run the block through the cipher
        threefishDecryptBlockWords(key, &cipher_text[block], &cipher_text[block]);
        if(block == 0) //xor the first block with the initialization vector
        {
            cipher_text[0] ^= iv[0]; cipher_text[1] ^= iv[1];
            cipher_text[2] ^= iv[2]; cipher_text[3] ^= iv[3];
            cipher_text[4] ^= iv[4]; cipher_text[5] ^= iv[5];
            cipher_text[6] ^= iv[6]; cipher_text[7] ^= iv[7];
        }
        else //xor the current block with the previous block of cipher text
        {
            if(even)
            {
                cipher_text[block] ^= prev_block_odd[0];
                cipher_text[block+1] ^= prev_block_odd[1];
                cipher_text[block+2] ^= prev_block_odd[2];
                cipher_text[block+3] ^= prev_block_odd[3];
                cipher_text[block+4] ^= prev_block_odd[4];
                cipher_text[block+5] ^= prev_block_odd[5];
                cipher_text[block+6] ^= prev_block_odd[6];
                cipher_text[block+7] ^= prev_block_odd[7];
            }
            else
            {
                cipher_text[block] ^= prev_block_even[0];
                cipher_text[block+1] ^= prev_block_even[1];
                cipher_text[block+2] ^= prev_block_even[2];
                cipher_text[block+3] ^= prev_block_even[3];
                cipher_text[block+4] ^= prev_block_even[4];
                cipher_text[block+5] ^= prev_block_even[5];
                cipher_text[block+6] ^= prev_block_even[6];
                cipher_text[block+7] ^= prev_block_even[7];
            }
        }
    }
}